

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_cgraph * ggml_new_graph_custom(ggml_context *ctx,size_t size,_Bool grads)

{
  ggml_cgraph *pgVar1;
  undefined4 *puVar2;
  long lVar3;
  long lVar4;
  void *__s;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  ggml_object *pgVar8;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  undefined7 in_register_00000011;
  void *pvVar12;
  
  iVar11 = (int)CONCAT71(in_register_00000011,grads);
  sVar7 = ggml_graph_nbytes(size,grads);
  pgVar8 = ggml_new_object(ctx,GGML_OBJECT_TYPE_GRAPH,sVar7);
  pvVar5 = ctx->mem_buffer;
  sVar7 = pgVar8->offs;
  pgVar1 = (ggml_cgraph *)((long)pvVar5 + sVar7);
  sVar9 = ggml_hash_size(size * 2);
  puVar2 = (undefined4 *)((long)pvVar5 + sVar7);
  uVar10 = (long)puVar2 + 0x57U & 0xfffffffffffffff8;
  lVar3 = uVar10 + size * 8;
  lVar4 = lVar3 + size * 8;
  pvVar5 = (void *)(lVar4 + sVar9 * 8);
  pvVar12 = (void *)((long)pvVar5 + sVar9 * 8);
  __s = (void *)((long)pvVar12 + sVar9 * 8);
  pvVar6 = pvVar5;
  if (iVar11 == 0) {
    pvVar12 = (void *)0x0;
    pvVar6 = (void *)0x0;
    __s = pvVar5;
  }
  *puVar2 = (int)size;
  *(undefined8 *)(puVar2 + 1) = 0;
  *(ulong *)(puVar2 + 4) = uVar10;
  *(void **)(puVar2 + 6) = pvVar6;
  *(void **)(puVar2 + 8) = pvVar12;
  *(long *)(puVar2 + 10) = lVar3;
  *(size_t *)(puVar2 + 0xc) = sVar9;
  *(void **)(puVar2 + 0xe) = __s;
  *(long *)(puVar2 + 0x10) = lVar4;
  puVar2[0x12] = 0;
  memset(__s,0,sVar9 + 0x1f >> 3 & 0xfffffffffffffffc);
  if (iVar11 != 0) {
    memset(pgVar1->grads,0,sVar9 << 3);
    memset(pgVar1->grad_accs,0,sVar9 << 3);
  }
  return pgVar1;
}

Assistant:

struct ggml_cgraph * ggml_new_graph_custom(struct ggml_context * ctx, size_t size, bool grads) {
    const size_t obj_size = ggml_graph_nbytes(size, grads);
    struct ggml_object * obj = ggml_new_object(ctx, GGML_OBJECT_TYPE_GRAPH, obj_size);
    struct ggml_cgraph * cgraph = (struct ggml_cgraph *) ((char *) ctx->mem_buffer + obj->offs);

    // the size of the hash table is doubled since it needs to hold both nodes and leafs
    size_t hash_size = ggml_hash_size(size * 2);

    void * p = cgraph + 1;

    struct ggml_tensor ** nodes_ptr     =         incr_ptr_aligned(&p, size      * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** leafs_ptr     =         incr_ptr_aligned(&p, size      * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** hash_keys_ptr =         incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** grads_ptr     = grads ? incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)) : NULL;
    struct ggml_tensor ** grad_accs_ptr = grads ? incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)) : NULL;

    ggml_bitset_t * hash_used = incr_ptr_aligned(&p, ggml_bitset_size(hash_size) * sizeof(ggml_bitset_t), sizeof(ggml_bitset_t));

    // check that we allocated the correct amount of memory
    assert(obj_size == (size_t)((char *)p - (char *)cgraph));

    *cgraph = (struct ggml_cgraph) {
        /*.size         =*/ size,
        /*.n_nodes      =*/ 0,
        /*.n_leafs      =*/ 0,
        /*.nodes        =*/ nodes_ptr,
        /*.grads        =*/ grads_ptr,
        /*.grad_accs    =*/ grad_accs_ptr,
        /*.leafs        =*/ leafs_ptr,
        /*.hash_table   =*/ { hash_size, hash_used, hash_keys_ptr },
        /*.order        =*/ GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT,
    };

    ggml_hash_set_reset(&cgraph->visited_hash_set);
    if (grads) {
        memset(cgraph->grads,     0, hash_size*sizeof(struct ggml_tensor *));
        memset(cgraph->grad_accs, 0, hash_size*sizeof(struct ggml_tensor *));
    }

    return cgraph;
}